

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_joy.cpp
# Opt level: O0

bool M_LoadJoystickConfig(IJoystickConfig *joy)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  double dVar6;
  int local_50;
  uint local_4c;
  EJoyAxis gameaxis;
  int i;
  int numaxes;
  int axislen;
  char *value;
  char key [32];
  IJoystickConfig *joy_local;
  
  key._24_8_ = joy;
  (*joy->_vptr_IJoystickConfig[0x11])();
  bVar2 = M_SetJoystickConfigSection((IJoystickConfig *)key._24_8_,false);
  if (bVar2) {
    pcVar5 = FConfigFile::GetValueForKey(&GameConfig->super_FConfigFile,"Sensitivity");
    uVar1 = key._24_8_;
    if (pcVar5 != (char *)0x0) {
      dVar6 = atof(pcVar5);
      (**(code **)(*(long *)uVar1 + 0x20))((float)dVar6);
    }
    iVar3 = (**(code **)(*(long *)key._24_8_ + 0x28))();
    for (local_4c = 0; (int)local_4c < iVar3; local_4c = local_4c + 1) {
      iVar4 = mysnprintf((char *)&value,0x20,"Axis%u",(ulong)local_4c);
      mysnprintf(key + (long)iVar4 + -8,0x20 - (long)iVar4,"deadzone");
      pcVar5 = FConfigFile::GetValueForKey(&GameConfig->super_FConfigFile,(char *)&value);
      uVar1 = key._24_8_;
      if (pcVar5 != (char *)0x0) {
        dVar6 = atof(pcVar5);
        (**(code **)(*(long *)uVar1 + 0x50))((float)dVar6,uVar1,local_4c);
      }
      mysnprintf(key + (long)iVar4 + -8,0x20 - (long)iVar4,"scale");
      pcVar5 = FConfigFile::GetValueForKey(&GameConfig->super_FConfigFile,(char *)&value);
      uVar1 = key._24_8_;
      if (pcVar5 != (char *)0x0) {
        dVar6 = atof(pcVar5);
        (**(code **)(*(long *)uVar1 + 0x60))((float)dVar6,uVar1,local_4c);
      }
      mysnprintf(key + (long)iVar4 + -8,0x20 - (long)iVar4,"map");
      pcVar5 = FConfigFile::GetValueForKey(&GameConfig->super_FConfigFile,(char *)&value);
      if (pcVar5 != (char *)0x0) {
        local_50 = atoi(pcVar5);
        if ((local_50 < -1) || (4 < local_50)) {
          local_50 = -1;
        }
        (**(code **)(*(long *)key._24_8_ + 0x58))(key._24_8_,local_4c,local_50);
      }
    }
    joy_local._7_1_ = true;
  }
  else {
    joy_local._7_1_ = false;
  }
  return joy_local._7_1_;
}

Assistant:

bool M_LoadJoystickConfig(IJoystickConfig *joy)
{
	char key[32];
	const char *value;
	int axislen;
	int numaxes;

	joy->SetDefaultConfig();
	if (!M_SetJoystickConfigSection(joy, false))
	{
		return false;
	}
	value = GameConfig->GetValueForKey("Sensitivity");
	if (value != NULL)
	{
		joy->SetSensitivity((float)atof(value));
	}
	numaxes = joy->GetNumAxes();
	for (int i = 0; i < numaxes; ++i)
	{
		axislen = mysnprintf(key, countof(key), "Axis%u", i);

		mysnprintf(key + axislen, countof(key) - axislen, "deadzone");
		value = GameConfig->GetValueForKey(key);
		if (value != NULL)
		{
			joy->SetAxisDeadZone(i, (float)atof(value));
		}

		mysnprintf(key + axislen, countof(key) - axislen, "scale");
		value = GameConfig->GetValueForKey(key);
		if (value != NULL)
		{
			joy->SetAxisScale(i, (float)atof(value));
		}

		mysnprintf(key + axislen, countof(key) - axislen, "map");
		value = GameConfig->GetValueForKey(key);
		if (value != NULL)
		{
			EJoyAxis gameaxis = (EJoyAxis)atoi(value);
			if (gameaxis < JOYAXIS_None || gameaxis >= NUM_JOYAXIS)
			{
				gameaxis = JOYAXIS_None;
			}
			joy->SetAxisMap(i, gameaxis);
		}
	}
	return true;
}